

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O0

void __thiscall libDAI::IJGP::updateMessage(IJGP *this,size_t e)

{
  pointer pVVar1;
  bool bVar2;
  R_edge_t *pRVar3;
  TFactor<double> *this_00;
  TFactor<double> *Q;
  reference puVar4;
  IJGP *this_01;
  Factor *x;
  TFactor<double> *in_RDI;
  Factor newmessage;
  R_nb_cit alpha2;
  R_nb_cit beta2;
  Factor prod;
  size_t beta;
  size_t alpha;
  TFactor<double> *in_stack_fffffffffffffdf8;
  RegionGraph *in_stack_fffffffffffffe00;
  TFactor<double> *in_stack_fffffffffffffe08;
  IJGP *in_stack_fffffffffffffe10;
  R_nb_t *in_stack_fffffffffffffe40;
  TFactor<double> *in_stack_fffffffffffffe48;
  undefined1 normed;
  TFactor<double> *in_stack_ffffffffffffff20;
  TFactor<double> *in_stack_ffffffffffffff28;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  unsigned_long *local_80;
  unsigned_long *local_68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60 [8];
  unsigned_long local_20;
  unsigned_long local_18;
  
  (**(code **)((long)((in_RDI->_vs)._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start + 2) + 8))();
  pRVar3 = RegionGraph::Redge(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
  local_18 = pRVar3->first;
  (**(code **)((long)((in_RDI->_vs)._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start + 2) + 8))();
  pRVar3 = RegionGraph::Redge(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
  local_20 = pRVar3->second;
  (**(code **)((long)((in_RDI->_vs)._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start + 2) + 8))();
  RegionGraph::OR(in_stack_fffffffffffffe00,(long)in_stack_fffffffffffffdf8);
  TFactor<double>::TFactor((TFactor<double> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  (**(code **)((long)((in_RDI->_vs)._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start + 2) + 8))();
  this_00 = (TFactor<double> *)
            RegionGraph::nbOR(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
  local_68 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffdf8);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_fffffffffffffe00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_fffffffffffffdf8);
  while( true ) {
    Q = (TFactor<double> *)
        (**(code **)((long)((in_RDI->_vs)._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start + 2) + 8))();
    RegionGraph::nbOR(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
    local_80 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar2) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_60);
    if (*puVar4 != local_20) {
      in_stack_fffffffffffffe48 =
           (TFactor<double> *)
           (**(code **)((long)((in_RDI->_vs)._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start + 2) + 8))();
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_60);
      in_stack_fffffffffffffe40 =
           RegionGraph::nbIR(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdf8)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffe00,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffdf8);
      while( true ) {
        (**(code **)((long)((in_RDI->_vs)._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start + 2) + 8))();
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_60);
        RegionGraph::nbIR(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffdf8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffe00,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffdf8);
        if (!bVar2) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_88);
        if (*puVar4 != local_18) {
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(&local_88);
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_60);
          message(in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08,
                  (size_t)in_stack_fffffffffffffe00);
          TFactor<double>::operator*=(this_00,Q);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  }
  (**(code **)((long)((in_RDI->_vs)._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start + 2) + 8))();
  normed = (undefined1)((ulong)Q >> 0x38);
  this_01 = (IJGP *)RegionGraph::IR(in_stack_fffffffffffffe00,(long)in_stack_fffffffffffffdf8);
  TFactor<double>::marginal(in_RDI,&this_00->_vs,(bool)normed);
  pVVar1 = in_RDI[9]._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  if (((double)pVVar1 != 0.0) || (NAN((double)pVVar1))) {
    in_stack_fffffffffffffe00 =
         (RegionGraph *)
         message(this_01,(size_t)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00);
    TFactor<double>::operator^(in_stack_fffffffffffffe48,(Real)in_stack_fffffffffffffe40);
    TFactor<double>::operator^(in_stack_fffffffffffffe48,(Real)in_stack_fffffffffffffe40);
    TFactor<double>::operator*(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    x = message(this_01,(size_t)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00);
    TFactor<double>::operator=((TFactor<double> *)in_stack_fffffffffffffe00,x);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe00);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe00);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe00);
  }
  else {
    message(this_01,(size_t)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe00);
  TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe00);
  return;
}

Assistant:

void IJGP::updateMessage(size_t e) {
        size_t alpha = grm().Redge(e).first;
        size_t beta = grm().Redge(e).second;
        
        Factor prod = grm().OR(alpha);
        for( RegionGraph::R_nb_cit beta2 = grm().nbOR(alpha).begin(); beta2 != grm().nbOR(alpha).end(); beta2++ )
            if( *beta2 != beta )
                for( RegionGraph::R_nb_cit alpha2 = grm().nbIR(*beta2).begin(); alpha2 != grm().nbIR(*beta2).end(); alpha2++ )
                    if( *alpha2 != alpha )
                        prod *= message(*alpha2, *beta2);
        Factor newmessage = prod.marginal( grm().IR(beta) );

        if( Props.damping == 0.0 )
            message(alpha, beta) = newmessage;
        else
            message(alpha, beta) = (message(alpha,beta) ^ Props.damping) * (newmessage ^ (1.0 - Props.damping));
    }